

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynTypedef * ParseTypedef(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  int iVar2;
  SynBase *type;
  undefined4 extraout_var;
  Lexeme *pLVar3;
  SynIdentifier *this;
  Lexeme *end;
  undefined4 extraout_var_01;
  SynTypedef *this_00;
  InplaceStr name;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_typedef) {
    ctx->currentLexeme = begin + 1;
    type = ParseType(ctx,(bool *)0x0,false);
    if (type == (SynBase *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: typename expected after typedef");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      type = (SynBase *)CONCAT44(extraout_var,iVar2);
      pLVar3 = ParseContext::Previous(ctx);
      SynError::SynError((SynError *)type,begin,pLVar3);
    }
    bVar1 = anon_unknown.dwarf_147a9::CheckAt
                      (ctx,lex_string,
                       "ERROR: alias name expected after typename in typedef expression");
    if (bVar1) {
      name = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar2);
      pLVar3 = ParseContext::Previous(ctx);
      end = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(this,pLVar3,end,name);
    }
    else {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynIdentifier *)CONCAT44(extraout_var_01,iVar2);
      SynIdentifier::SynIdentifier(this,(InplaceStr)ZEXT816(0));
    }
    anon_unknown.dwarf_147a9::CheckConsume(ctx,lex_semicolon,"ERROR: \';\' not found after typedef")
    ;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this_00 = (SynTypedef *)CONCAT44(extraout_var_02,iVar2);
    pLVar3 = ParseContext::Previous(ctx);
    SynTypedef::SynTypedef(this_00,begin,pLVar3,type,this);
  }
  else {
    this_00 = (SynTypedef *)0x0;
  }
  return this_00;
}

Assistant:

SynTypedef* ParseTypedef(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_typedef))
	{
		SynBase *type = ParseType(ctx);

		if(!type)
		{
			Report(ctx, ctx.Current(), "ERROR: typename expected after typedef");

			type = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}

		SynIdentifier *aliasIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: alias name expected after typename in typedef expression"))
		{
			InplaceStr alias = ctx.Consume();
			aliasIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), alias);
		}
		else
		{
			aliasIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after typedef");

		return new (ctx.get<SynTypedef>()) SynTypedef(start, ctx.Previous(), type, aliasIdentifier);
	}

	return NULL;
}